

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc * stbi__resample_row_hv_2_simd(stbi_uc *out,stbi_uc *in_near,stbi_uc *in_far,int w,int hs)

{
  byte bVar1;
  undefined1 auVar2 [16];
  long lVar3;
  long lVar4;
  stbi_uc sVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  bVar1 = *in_near;
  if (w != 1) {
    iVar6 = (uint)*in_far + (uint)bVar1 + (uint)bVar1 * 2;
    uVar7 = w - 1U & 0xfffffff8;
    if ((int)uVar7 < 1) {
      uVar8 = 0;
      iVar9 = iVar6;
    }
    else {
      auVar10._8_2_ = 8;
      auVar10._0_8_ = 0x8000800080008;
      auVar10._10_2_ = 8;
      auVar10._12_2_ = 8;
      auVar10._14_2_ = 8;
      uVar8 = 0;
      iVar9 = iVar6;
      do {
        auVar11._8_8_ = 0;
        auVar11._0_8_ = *(ulong *)(in_far + uVar8);
        auVar11 = vpmovzxbw_avx(auVar11);
        auVar12._8_8_ = 0;
        auVar12._0_8_ = *(ulong *)(in_near + uVar8);
        auVar12 = vpmovzxbw_avx(auVar12);
        auVar11 = vpsubw_avx(auVar11,auVar12);
        auVar12 = vpsllw_avx(auVar12,2);
        auVar11 = vpaddw_avx(auVar12,auVar11);
        auVar12 = vpslldq_avx(auVar11,2);
        auVar13 = vpsrldq_avx(auVar11,2);
        auVar14 = vpsllw_avx(auVar11,2);
        auVar2 = vpinsrw_avx(auVar12,iVar9,0);
        auVar12 = vpaddw_avx(auVar14,auVar10);
        auVar2 = vpsubw_avx(auVar2,auVar11);
        auVar2 = vpaddw_avx(auVar2,auVar12);
        auVar13 = vpinsrw_avx(auVar13,(uint)in_far[uVar8 + 8] +
                                      (uint)in_near[uVar8 + 8] + (uint)in_near[uVar8 + 8] * 2,7);
        auVar11 = vpsubw_avx(auVar13,auVar11);
        auVar11 = vpaddw_avx(auVar11,auVar12);
        auVar12 = vpunpcklwd_avx(auVar2,auVar11);
        auVar11 = vpunpckhwd_avx(auVar2,auVar11);
        auVar12 = vpsrlw_avx(auVar12,4);
        auVar11 = vpsrlw_avx(auVar11,4);
        auVar11 = vpackuswb_avx(auVar12,auVar11);
        *(undefined1 (*) [16])(out + uVar8 * 2) = auVar11;
        lVar3 = uVar8 + 7;
        lVar4 = uVar8 + 7;
        uVar8 = uVar8 + 8;
        iVar9 = (uint)in_far[lVar4] + (uint)in_near[lVar3] + (uint)in_near[lVar3] * 2;
      } while (uVar8 < uVar7);
      iVar6 = (uint)in_near[uVar8] + (uint)in_near[uVar8] * 2 + (uint)in_far[uVar8];
    }
    out[(uVar8 & 0xffffffff) * 2] = (stbi_uc)((uint)(iVar9 + 8 + iVar6 * 3) >> 4);
    if ((int)((uint)uVar8 | 1) < w) {
      uVar8 = (uVar8 & 0xffffffff) + 1;
      iVar9 = iVar6;
      do {
        iVar6 = (uint)in_far[uVar8] + (uint)in_near[uVar8] + (uint)in_near[uVar8] * 2;
        out[uVar8 * 2 + -1] = (stbi_uc)((uint)(iVar9 * 3 + 8 + iVar6) >> 4);
        out[uVar8 * 2] = (stbi_uc)((uint)(iVar9 + 8 + iVar6 * 3) >> 4);
        uVar8 = uVar8 + 1;
        iVar9 = iVar6;
      } while ((uint)w != uVar8);
    }
    out[(long)w * 2 + -1] = (stbi_uc)(iVar6 + 2U >> 2);
    return out;
  }
  sVar5 = (stbi_uc)(*in_far + 2 + (uint)bVar1 + (uint)bVar1 * 2 >> 2);
  out[1] = sVar5;
  *out = sVar5;
  return out;
}

Assistant:

static stbi_uc *stbi__resample_row_hv_2_simd(stbi_uc *out, stbi_uc *in_near, stbi_uc *in_far, int w, int hs)
{
   // need to generate 2x2 samples for every one in input
   int i=0,t0,t1;

   if (w == 1) {
      out[0] = out[1] = stbi__div4(3*in_near[0] + in_far[0] + 2);
      return out;
   }

   t1 = 3*in_near[0] + in_far[0];
   // process groups of 8 pixels for as long as we can.
   // note we can't handle the last pixel in a row in this loop
   // because we need to handle the filter boundary conditions.
   for (; i < ((w-1) & ~7); i += 8) {
#if defined(STBI_SSE2)
      // load and perform the vertical filtering pass
      // this uses 3*x + y = 4*x + (y - x)
      __m128i zero  = _mm_setzero_si128();
      __m128i farb  = _mm_loadl_epi64((__m128i *) (in_far + i));
      __m128i nearb = _mm_loadl_epi64((__m128i *) (in_near + i));
      __m128i farw  = _mm_unpacklo_epi8(farb, zero);
      __m128i nearw = _mm_unpacklo_epi8(nearb, zero);
      __m128i diff  = _mm_sub_epi16(farw, nearw);
      __m128i nears = _mm_slli_epi16(nearw, 2);
      __m128i curr  = _mm_add_epi16(nears, diff); // current row

      // horizontal filter works the same based on shifted vers of current
      // row. "prev" is current row shifted right by 1 pixel; we need to
      // insert the previous pixel value (from t1).
      // "next" is current row shifted left by 1 pixel, with first pixel
      // of next block of 8 pixels added in.
      __m128i prv0 = _mm_slli_si128(curr, 2);
      __m128i nxt0 = _mm_srli_si128(curr, 2);
      __m128i prev = _mm_insert_epi16(prv0, t1, 0);
      __m128i next = _mm_insert_epi16(nxt0, 3*in_near[i+8] + in_far[i+8], 7);

      // horizontal filter, polyphase implementation since it's convenient:
      // even pixels = 3*cur + prev = cur*4 + (prev - cur)
      // odd  pixels = 3*cur + next = cur*4 + (next - cur)
      // note the shared term.
      __m128i bias  = _mm_set1_epi16(8);
      __m128i curs = _mm_slli_epi16(curr, 2);
      __m128i prvd = _mm_sub_epi16(prev, curr);
      __m128i nxtd = _mm_sub_epi16(next, curr);
      __m128i curb = _mm_add_epi16(curs, bias);
      __m128i even = _mm_add_epi16(prvd, curb);
      __m128i odd  = _mm_add_epi16(nxtd, curb);

      // interleave even and odd pixels, then undo scaling.
      __m128i int0 = _mm_unpacklo_epi16(even, odd);
      __m128i int1 = _mm_unpackhi_epi16(even, odd);
      __m128i de0  = _mm_srli_epi16(int0, 4);
      __m128i de1  = _mm_srli_epi16(int1, 4);

      // pack and write output
      __m128i outv = _mm_packus_epi16(de0, de1);
      _mm_storeu_si128((__m128i *) (out + i*2), outv);
#elif defined(STBI_NEON)
      // load and perform the vertical filtering pass
      // this uses 3*x + y = 4*x + (y - x)
      uint8x8_t farb  = vld1_u8(in_far + i);
      uint8x8_t nearb = vld1_u8(in_near + i);
      int16x8_t diff  = vreinterpretq_s16_u16(vsubl_u8(farb, nearb));
      int16x8_t nears = vreinterpretq_s16_u16(vshll_n_u8(nearb, 2));
      int16x8_t curr  = vaddq_s16(nears, diff); // current row

      // horizontal filter works the same based on shifted vers of current
      // row. "prev" is current row shifted right by 1 pixel; we need to
      // insert the previous pixel value (from t1).
      // "next" is current row shifted left by 1 pixel, with first pixel
      // of next block of 8 pixels added in.
      int16x8_t prv0 = vextq_s16(curr, curr, 7);
      int16x8_t nxt0 = vextq_s16(curr, curr, 1);
      int16x8_t prev = vsetq_lane_s16(t1, prv0, 0);
      int16x8_t next = vsetq_lane_s16(3*in_near[i+8] + in_far[i+8], nxt0, 7);

      // horizontal filter, polyphase implementation since it's convenient:
      // even pixels = 3*cur + prev = cur*4 + (prev - cur)
      // odd  pixels = 3*cur + next = cur*4 + (next - cur)
      // note the shared term.
      int16x8_t curs = vshlq_n_s16(curr, 2);
      int16x8_t prvd = vsubq_s16(prev, curr);
      int16x8_t nxtd = vsubq_s16(next, curr);
      int16x8_t even = vaddq_s16(curs, prvd);
      int16x8_t odd  = vaddq_s16(curs, nxtd);

      // undo scaling and round, then store with even/odd phases interleaved
      uint8x8x2_t o;
      o.val[0] = vqrshrun_n_s16(even, 4);
      o.val[1] = vqrshrun_n_s16(odd,  4);
      vst2_u8(out + i*2, o);
#endif

      // "previous" value for next iter
      t1 = 3*in_near[i+7] + in_far[i+7];
   }

   t0 = t1;
   t1 = 3*in_near[i] + in_far[i];
   out[i*2] = stbi__div16(3*t1 + t0 + 8);

   for (++i; i < w; ++i) {
      t0 = t1;
      t1 = 3*in_near[i]+in_far[i];
      out[i*2-1] = stbi__div16(3*t0 + t1 + 8);
      out[i*2  ] = stbi__div16(3*t1 + t0 + 8);
   }
   out[w*2-1] = stbi__div4(t1+2);

   STBI_NOTUSED(hs);

   return out;
}